

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O3

void __thiscall
TEST_MockSupport_c_MockSupportSetBoolData_Test::testBody
          (TEST_MockSupport_c_MockSupportSetBoolData_Test *this)

{
  MockSupport_c *pMVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  char *pcVar4;
  char *pcVar5;
  MockValue_c MVar6;
  MockValue_c MVar7;
  SimpleString SStack_38;
  SimpleString local_28;
  
  pMVar1 = mock_c();
  (*pMVar1->setBoolData)("boolean",1);
  pMVar1 = mock_c();
  MVar6 = (*pMVar1->getData)("boolean");
  if (MVar6.value._0_4_ == 1) {
    pUVar2 = UtestShell::getCurrent();
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
               ,0x231,pTVar3);
  }
  else {
    pMVar1 = mock_c();
    MVar6 = (*pMVar1->getData)("boolean");
    pMVar1 = mock_c();
    MVar7 = (*pMVar1->getData)("boolean");
    if (MVar6.value._0_4_ != MVar7.value._0_4_) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
                 ,0x231);
    }
    pUVar2 = UtestShell::getCurrent();
    ::StringFrom((int)&local_28);
    pcVar4 = SimpleString::asCharString(&local_28);
    pMVar1 = mock_c();
    (*pMVar1->getData)("boolean");
    ::StringFrom((int)&SStack_38);
    pcVar5 = SimpleString::asCharString(&SStack_38);
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
               ,0x231,pTVar3);
    SimpleString::~SimpleString(&SStack_38);
    SimpleString::~SimpleString(&local_28);
  }
  return;
}

Assistant:

TEST(MockSupport_c, MockSupportSetBoolData)
{
    mock_c()->setBoolData("boolean", 1);
    CHECK_EQUAL(1, mock_c()->getData("boolean").value.boolValue);
}